

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched,ggml_backend_t backend)

{
  int iVar1;
  size_t sVar2;
  ggml_backend_t in_RSI;
  ggml_backend_sched_t in_RDI;
  int backend_index;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = ggml_backend_sched_backend_id(in_RDI,in_RSI);
  if ((-1 < iVar1) && (iVar1 < in_RDI->n_backends)) {
    sVar2 = ggml_gallocr_get_buffer_size
                      ((ggml_gallocr_t)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0);
    return sVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x657,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends");
}

Assistant:

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);

    return ggml_gallocr_get_buffer_size(sched->galloc, backend_index);
}